

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O0

map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
* __thiscall
Pda::initMap(map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
             *__return_storage_ptr__,Pda *this,Node *n)

{
  bool bVar1;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *this_00;
  mapped_type *pmVar2;
  char local_59;
  reference local_58;
  Transition **f;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *__range1;
  Node *n_local;
  Pda *this_local;
  map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
  *m;
  
  std::
  map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
  ::map(__return_storage_ptr__);
  this_00 = Tjen::Node::getTransitions(n);
  __end1 = std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::begin
                     (this_00);
  f = (Transition **)
      std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::end(this_00)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
                                     *)&f), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
               ::operator*(&__end1);
    local_59 = Tjen::Node::Transition::getInput(*local_58);
    pmVar2 = std::
             map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
             ::operator[](__return_storage_ptr__,&local_59);
    *pmVar2 = *pmVar2 + 1;
    __gnu_cxx::
    __normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<const char, unsigned int> Pda::initMap(Tjen::Node *n) {
    std::map<const char, unsigned int> m;
    for (auto &f: n->getTransitions()) {
        m[f->getInput()] ++;
    }
    return m;
}